

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O2

void __thiscall AviWriter::useFrame(AviWriter *this,avi_frame_t *frame)

{
  int64_t iVar1;
  uint uVar2;
  int64_t *piVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  AVIIndexRecord *indexRecord;
  
  iVar1 = frame->pts;
  iVar6 = (int)iVar1;
  if (frame->type == 'A') {
    piVar3 = &this->fPrevAudioPts;
    uVar2 = 0x62773130;
    if ((this->fPrevAudioPts != 0) &&
       (uVar4 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)(iVar6 - (int)this->fPrevAudioPts)),
       this->fAudioMaxBytesPerSecond < uVar4)) {
      this->fAudioMaxBytesPerSecond = uVar4;
    }
    lVar7 = 0;
  }
  else {
    piVar3 = &this->fPrevVideoPts;
    uVar2 = 0x63643030;
    lVar7 = 4;
    if ((this->fPrevVideoPts != 0) &&
       (uVar4 = (uint)(long)(((double)frame->size * 1000000.0) /
                            (double)(iVar6 - (int)this->fPrevVideoPts)),
       this->fVideoMaxBytesPerSecond < uVar4)) {
      this->fVideoMaxBytesPerSecond = uVar4;
    }
  }
  *piVar3 = iVar1;
  indexRecord = (AVIIndexRecord *)operator_new(0x10);
  indexRecord->fChunkId = uVar2;
  indexRecord->fFlags = (uint)(frame->data[lVar7] == 'g') << 4;
  indexRecord->fOffset = this->fNumBytesWritten + 4;
  indexRecord->fSize = frame->size;
  std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::push_back
            (&(this->indexRecords).c,&indexRecord);
  addWord(this,uVar2);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  addWord(this,frame->size);
  this->fNumBytesWritten = this->fNumBytesWritten + 4;
  fwrite(frame->data,1,(long)frame->size,(FILE *)this->fOutFid);
  uVar2 = frame->size;
  this->fNumBytesWritten = this->fNumBytesWritten + uVar2;
  if ((uVar2 & 1) == 0) {
    uVar2 = addByte(this,'\0');
    this->fNumBytesWritten = this->fNumBytesWritten + uVar2;
  }
  puVar5 = &this->fNumAudioFrames;
  if (frame->type != 'A') {
    puVar5 = &this->fNumVideoFrames;
  }
  *puVar5 = *puVar5 + 1;
  return;
}

Assistant:

void AviWriter::useFrame(const avi_frame_t &frame)
{
    if (frame.type == AVI_AUDIO_FRAME) {
        if (fPrevAudioPts) {
            int uSecondsDiff = frame.pts - fPrevAudioPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fAudioMaxBytesPerSecond)
                fAudioMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevAudioPts = frame.pts;
    } else {
        if (fPrevVideoPts) {
            int uSecondsDiff = frame.pts - fPrevVideoPts;
            unsigned bytePerSeconds = frame.size * 1000000.0 / uSecondsDiff;
            if (bytePerSeconds > fVideoMaxBytesPerSecond)
                fVideoMaxBytesPerSecond = bytePerSeconds;
        }

        fPrevVideoPts = frame.pts;
    }

    unsigned subsessionTag = (frame.type == AVI_AUDIO_FRAME ? fourChar('0', '1', 'w', 'b') : fourChar('0', '0', 'd', 'c'));

    auto indexRecord = new AVIIndexRecord;

    indexRecord->fChunkId = subsessionTag;
    int testIndex = (frame.type == AVI_AUDIO_FRAME ? 0 : 4);
    indexRecord->fFlags = frame.data[testIndex] == 0x67 ? 0x10 : 0;
    indexRecord->fOffset = 4 + fNumBytesWritten; // riff chunk header offset from movi chunk start (4 = movi)
    indexRecord->fSize = frame.size; // chunk size excluding riff header size (only frame data)

    indexRecords.push(indexRecord);

    fNumBytesWritten += addWord(subsessionTag);
    fNumBytesWritten += addWord(frame.size);

    fwrite(frame.data, 1, frame.size, fOutFid);
    fNumBytesWritten += frame.size;

    // Pad to an even length:

    if (frame.size % 2 == 0)
        fNumBytesWritten += addByte(0);

    (frame.type == AVI_AUDIO_FRAME ? fNumAudioFrames : fNumVideoFrames)++;
}